

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall NavierStokesBase::initRhoAvg(NavierStokesBase *this,Real alpha)

{
  MultiFab *this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  MFIter mfi;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (((this->super_AmrLevel).state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start)->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_00 = &this->rho_avg;
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&this_00->super_FabArray<amrex::FArrayBox>,1e+200,0,
             (this->rho_avg).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &(this->rho_avg).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  amrex::MFIter::MFIter(&local_90,(FabArrayBase *)this_00,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      amrex::MFIter::tilebox(&local_12c,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&this_00->super_FabArray<amrex::FArrayBox>,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,
                 (FabArray<amrex::FArrayBox> *)
                 this_01.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90,3);
      if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
        lVar5 = (long)local_12c.smallend.vect[1];
        iVar1 = local_12c.smallend.vect[2];
        do {
          if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
            lVar4 = (long)local_d0.p +
                    ((long)iVar1 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                    (lVar5 - local_d0.begin.y) * local_d0.jstride * 8 +
                    (long)local_12c.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8;
            lVar3 = (long)local_110.p +
                    ((long)iVar1 - (long)local_110.begin.z) * local_110.kstride * 8 +
                    (lVar5 - local_110.begin.y) * local_110.jstride * 8 +
                    (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8;
            lVar6 = lVar5;
            do {
              if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                lVar2 = 0;
                do {
                  *(double *)(lVar4 + lVar2 * 8) = *(double *)(lVar3 + lVar2 * 8) * alpha;
                  lVar2 = lVar2 + 1;
                } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar2);
              }
              lVar6 = lVar6 + 1;
              lVar4 = lVar4 + local_d0.jstride * 8;
              lVar3 = lVar3 + local_110.jstride * 8;
            } while (local_12c.bigend.vect[1] + 1 != (int)lVar6);
          }
          bVar7 = iVar1 != local_12c.bigend.vect[2];
          iVar1 = iVar1 + 1;
        } while (bVar7);
      }
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
NavierStokesBase::initRhoAvg (Real alpha)
{
    const MultiFab& S_new = get_new_data(State_Type);

    // Set to a ridiculous number just for debugging -- shouldn't need this otherwise
    rho_avg.setVal(1.e200);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rho_avg,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       auto const& rhoavg     = rho_avg.array(mfi);
       auto const& rho_new    = S_new.array(mfi,Density);
       amrex::ParallelFor(bx, [rhoavg,rho_new,alpha]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
          rhoavg(i,j,k) = rho_new(i,j,k) * alpha;
       });
    }
}